

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterSparseCoDim
          (SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,SPxId *enterId)

{
  int i;
  pointer pnVar1;
  int iVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  DataKey DVar4;
  int *piVar5;
  pointer pnVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [13];
  undefined3 uStack_cb;
  int iStack_c8;
  bool bStack_c4;
  fpclass_type local_c0;
  int32_t iStack_bc;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar11 = 0;
  local_138 = (undefined1  [16])0x0;
  local_128 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_cb = 0;
  lVar9 = (long)(((this->
                  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thesolver)->infeasibilitiesCo).super_IdxSet.num;
  if (0 < lVar9) {
    uVar10 = lVar9 + 1;
    do {
      pSVar3 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      piVar5 = (pSVar3->infeasibilitiesCo).super_IdxSet.idx;
      i = piVar5[uVar10 - 2];
      pnVar1 = (pSVar3->theTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar6 = pnVar1 + i;
      pcVar8 = (cpp_dec_float<200U,_int,_void> *)local_138;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pcVar8->data)._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
        pnVar6 = (pointer)((long)pnVar6 + ((ulong)bVar11 * -2 + 1) * 4);
        pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar11 * -8 + 4);
      }
      iStack_c8 = pnVar1[i].m_backend.exp;
      bStack_c4 = pnVar1[i].m_backend.neg;
      local_c0 = pnVar1[i].m_backend.fpclass;
      iStack_bc = pnVar1[i].m_backend.prec_elem;
      pnVar7 = &(this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thetolerance;
      pcVar8 = &local_b0;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pcVar8->data)._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
        pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar7 + (ulong)bVar11 * -8 + 4);
        pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar11 * -8 + 4);
      }
      local_b0.exp = (this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thetolerance.m_backend.exp;
      local_b0.neg = (this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thetolerance.m_backend.neg;
      local_b0.fpclass =
           (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.fpclass;
      local_b0.prec_elem =
           (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.prec_elem;
      if (local_b0.data._M_elems[0] != 0 || local_b0.fpclass != cpp_dec_float_finite) {
        local_b0.neg = (bool)(local_b0.neg ^ 1);
      }
      if (local_c0 == cpp_dec_float_NaN || local_b0.fpclass == cpp_dec_float_NaN) {
LAB_005aa68c:
        iVar2 = (pSVar3->infeasibilitiesCo).super_IdxSet.num;
        (pSVar3->infeasibilitiesCo).super_IdxSet.num = iVar2 + -1;
        piVar5[uVar10 - 2] = piVar5[(long)iVar2 + -1];
        (pSVar3->isInfeasibleCo).data[i] = 0;
      }
      else {
        iVar2 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_138,&local_b0);
        if (-1 < iVar2) {
          pSVar3 = (this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          piVar5 = (pSVar3->infeasibilitiesCo).super_IdxSet.idx;
          goto LAB_005aa68c;
        }
        if (((local_c0 != cpp_dec_float_NaN) && ((best->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar2 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_138,&best->m_backend),
           iVar2 < 0)) {
          DVar4 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ::id((this->
                                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).thesolver,i);
          enterId->super_DataKey = DVar4;
          pcVar8 = (cpp_dec_float<200U,_int,_void> *)local_138;
          pnVar7 = best;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pnVar7->m_backend).data._M_elems[0] = (pcVar8->data)._M_elems[0];
            pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar11 * -8 + 4);
            pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)((long)pnVar7 + ((ulong)bVar11 * -2 + 1) * 4);
          }
          (best->m_backend).exp = iStack_c8;
          (best->m_backend).neg = bStack_c4;
          (best->m_backend).fpclass = local_c0;
          (best->m_backend).prec_elem = iStack_bc;
        }
      }
      uVar10 = uVar10 - 1;
    } while (1 < uVar10);
  }
  return (SPxId)enterId->super_DataKey;
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterSparseCoDim(R& best, SPxId& enterId)
{
   assert(this->thesolver != nullptr);

   int idx;
   R x;

   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = this->thesolver->test()[idx];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            enterId = this->thesolver->id(idx);
            best = x;
         }
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         assert(this->thesolver->isInfeasibleCo[idx] > 0);
         this->thesolver->isInfeasibleCo[idx] = 0;
      }
   }

   return enterId;
}